

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_setup_connection(connectdata *conn)

{
  SessionHandle *data_00;
  CURLcode result;
  SessionHandle *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  conn_local._4_4_ = pop3_init(conn);
  if (conn_local._4_4_ == CURLE_OK) {
    if ((((conn->bits).httpproxy & 1U) == 0) || (((data_00->set).tunnel_thru_httpproxy & 1U) != 0))
    {
      (data_00->state).path = (data_00->state).path + 1;
      conn_local._4_4_ = CURLE_OK;
    }
    else if (conn->handler == &Curl_handler_pop3) {
      conn->handler = &Curl_handler_pop3_proxy;
      conn_local._4_4_ = (*conn->handler->setup_connection)(conn);
    }
    else {
      Curl_failf(data_00,"POP3S not supported!");
      conn_local._4_4_ = CURLE_UNSUPPORTED_PROTOCOL;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_setup_connection(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;

  /* Initialise the POP3 layer */
  CURLcode result = pop3_init(conn);
  if(result)
    return result;

  if(conn->bits.httpproxy && !data->set.tunnel_thru_httpproxy) {
    /* Unless we have asked to tunnel POP3 operations through the proxy, we
       switch and use HTTP operations only */
#ifndef CURL_DISABLE_HTTP
    if(conn->handler == &Curl_handler_pop3)
      conn->handler = &Curl_handler_pop3_proxy;
    else {
#ifdef USE_SSL
      conn->handler = &Curl_handler_pop3s_proxy;
#else
      failf(data, "POP3S not supported!");
      return CURLE_UNSUPPORTED_PROTOCOL;
#endif
    }

    /* set it up as an HTTP connection instead */
    return conn->handler->setup_connection(conn);
#else
    failf(data, "POP3 over http proxy requires HTTP support built-in!");
    return CURLE_UNSUPPORTED_PROTOCOL;
#endif
  }

  data->state.path++;   /* don't include the initial slash */

  return CURLE_OK;
}